

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall bidirectional::Search::makeHeap(Search *this)

{
  vector<labelling::Label,_std::allocator<labelling::Label>_> *pvVar1;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  __first;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  __last;
  _Iter_comp_iter<std::greater<void>_> __cmp;
  _Iter_less_iter __comp;
  _Iter_comp_iter<std::greater<void>_> local_2;
  _Iter_less_iter local_1;
  
  pvVar1 = (this->unprocessed_labels)._M_t.
           super___uniq_ptr_impl<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           .
           super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
           ._M_head_impl;
  __first._M_current =
       *(Label **)
        &(pvVar1->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)._M_impl;
  __last._M_current =
       *(pointer *)
        ((long)&(pvVar1->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
                _M_impl + 8);
  if (this->direction == FWD) {
    std::
    __make_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (__first,__last,&local_2);
  }
  else {
    std::
    __make_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (__first,__last,&local_1);
  }
  return;
}

Assistant:

void Search::makeHeap() {
  if (direction == FWD) {
    // Min-heap
    std::make_heap(
        unprocessed_labels->begin(),
        unprocessed_labels->end(),
        std::greater<>{});
  } else {
    // Max-heap
    std::make_heap(unprocessed_labels->begin(), unprocessed_labels->end());
  }
}